

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

int uv_udp_init_ex(uv_loop_t *loop,uv_udp_t *handle,uint flags)

{
  uint domain_00;
  int rc;
  int domain;
  uint extra_flags;
  uint flags_local;
  uv_udp_t *handle_local;
  uv_loop_t *loop_local;
  
  domain_00 = flags & 0xff;
  if (((domain_00 == 2) || (domain_00 == 10)) || (domain_00 == 0)) {
    if ((flags & 0xfffffe00) == 0) {
      loop_local._4_4_ = uv__udp_init_ex(loop,handle,flags,domain_00);
      if ((loop_local._4_4_ == 0) && ((flags & 0x100) != 0)) {
        handle->flags = handle->flags | 0x4000000;
      }
    }
    else {
      loop_local._4_4_ = -0x16;
    }
  }
  else {
    loop_local._4_4_ = -0x16;
  }
  return loop_local._4_4_;
}

Assistant:

int uv_udp_init_ex(uv_loop_t* loop, uv_udp_t* handle, unsigned flags) {
  unsigned extra_flags;
  int domain;
  int rc;

  /* Use the lower 8 bits for the domain. */
  domain = flags & 0xFF;
  if (domain != AF_INET && domain != AF_INET6 && domain != AF_UNSPEC)
    return UV_EINVAL;

  /* Use the higher bits for extra flags. */
  extra_flags = flags & ~0xFF;
  if (extra_flags & ~UV_UDP_RECVMMSG)
    return UV_EINVAL;

  rc = uv__udp_init_ex(loop, handle, flags, domain);

  if (rc == 0)
    if (extra_flags & UV_UDP_RECVMMSG)
      handle->flags |= UV_HANDLE_UDP_RECVMMSG;

  return rc;
}